

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::predict_or_learn<false>(data *sm,single_learner *base,example *ec)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  features *pfVar4;
  undefined8 *puVar5;
  features *pfVar6;
  features *pfVar7;
  byte *pbVar8;
  byte bVar9;
  float fVar10;
  float fVar11;
  undefined8 local_80 [12];
  float local_20;
  
  bVar9 = 0;
  make_marginal<false>(sm,ec);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  if (sm->compete == true) {
    fVar10 = (ec->pred).scalar;
    sm->feature_pred = fVar10;
    fVar11 = sm->net_feature_weight;
    if (sm->net_weight + fVar11 <= 0.0) {
      sm->net_feature_weight = 1.0;
      fVar11 = 1.0;
    }
    else {
      fVar10 = fVar10 * fVar11 + sm->average_pred;
    }
    fVar10 = (1.0 / (sm->net_weight + fVar11)) * fVar10;
    sm->average_pred = fVar10;
    (ec->pred).scalar = fVar10;
    ec->partial_prediction = sm->average_pred;
  }
  pbVar8 = (ec->super_example_predict).indices._begin;
  pbVar3 = (ec->super_example_predict).indices._end;
  if (pbVar8 != pbVar3) {
    do {
      bVar1 = *pbVar8;
      if (sm->id_features[bVar1] == true) {
        pfVar7 = (ec->super_example_predict).feature_space + bVar1;
        pfVar4 = sm->temp + bVar1;
        puVar5 = local_80;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar5 = (pfVar4->values)._begin;
          pfVar4 = (features *)((long)pfVar4 + (ulong)bVar9 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
        }
        pfVar4 = pfVar7;
        pfVar6 = sm->temp + bVar1;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar6->values)._begin = (pfVar4->values)._begin;
          pfVar4 = (features *)((long)pfVar4 + ((ulong)bVar9 * -2 + 1) * 8);
          pfVar6 = (features *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
        }
        sm->temp[bVar1].sum_feat_sq = (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
        puVar5 = local_80;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar7->values)._begin = (float *)*puVar5;
          puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
          pfVar7 = (features *)((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        (ec->super_example_predict).feature_space[bVar1].sum_feat_sq = local_20;
        pbVar3 = (ec->super_example_predict).indices._end;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar3);
  }
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}